

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  Layer *pLVar5;
  undefined8 *puVar6;
  Mat *in_RSI;
  long in_RDI;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_000006a0;
  ConvolutionDepthWise_x86 *in_stack_000006a8;
  Option *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int iVar8;
  void **ppvVar7;
  Mat *dst;
  undefined4 in_stack_fffffffffffffe90;
  void *local_150;
  int *local_148;
  Allocator *local_130;
  Option *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int iVar9;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_e4;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  if (*(int *)(in_RDI + 0x160) == 0) {
    pLVar5 = create_activation_layer
                       ((int)((ulong)in_RDI >> 0x20),in_RSI,
                        (Option *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    *(Layer **)(in_RDI + 0x2d0) = pLVar5;
    if (((in_RSI->field_0x1e & 1) == 0) || (*(long *)(in_RDI + 0x178) != 1)) {
      uVar2 = (long)*(int *)(in_RDI + 0x104) / (long)*(int *)(in_RDI + 0x108);
      iVar3 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                   (long)(*(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8)));
      iVar4 = (iVar3 / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x108))) *
              *(int *)(in_RDI + 0x108);
      if ((iVar4 == *(int *)(in_RDI + 0x108)) &&
         (*(int *)(in_RDI + 0x108) == *(int *)(in_RDI + 0xd0))) {
        iVar9 = 1;
        if ((((ulong)in_RSI->allocator & 0x100000000000000) != 0) && (iVar9 = 1, iVar4 % 4 == 0)) {
          iVar9 = 4;
        }
        if (iVar9 == 4) {
          dst = (Mat *)&local_150;
          Mat::reshape((Mat *)CONCAT44(4,in_stack_fffffffffffffef8),in_stack_fffffffffffffef4,
                       in_stack_fffffffffffffef0,(Allocator *)in_stack_fffffffffffffee8);
          convert_packing((Mat *)CONCAT44(iVar3,in_stack_fffffffffffffe90),dst,iVar8,
                          in_stack_fffffffffffffe78);
          ppvVar7 = &local_150;
          if (local_148 != (int *)0x0) {
            LOCK();
            iVar8 = *local_148;
            *local_148 = *local_148 + -1;
            UNLOCK();
            if (iVar8 == 1) {
              if (local_130 == (Allocator *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (**(code **)(*(long *)local_130 + 0x18))(local_130,local_150);
              }
            }
          }
          *ppvVar7 = (void *)0x0;
          ppvVar7[2] = (void *)0x0;
          *(undefined4 *)(ppvVar7 + 3) = 0;
          *(undefined4 *)(ppvVar7 + 5) = 0;
          *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
          *(undefined4 *)(ppvVar7 + 6) = 0;
          *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
          *(undefined4 *)(ppvVar7 + 7) = 0;
          ppvVar7[8] = (void *)0x0;
          ppvVar7[1] = (void *)0x0;
        }
        if (iVar9 == 1) {
          if ((((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
              (*(int *)(in_RDI + 0xdc) == 1)) &&
             (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 1)) &&
              (*(int *)(in_RDI + 0xe8) == 1)))) {
            puVar6 = (undefined8 *)(in_RDI + 0x2f0);
            if (puVar6 != (undefined8 *)(in_RDI + 0x168)) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                LOCK();
                **(int **)(in_RDI + 0x170) = **(int **)(in_RDI + 0x170) + 1;
                UNLOCK();
              }
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                LOCK();
                iVar8 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (iVar8 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    if ((void *)*puVar6 != (void *)0x0) {
                      free((void *)*puVar6);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar6);
                  }
                }
              }
              *puVar6 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar6 = *(undefined8 *)(in_RDI + 0x168);
              *(undefined8 *)(in_RDI + 0x2f8) = *(undefined8 *)(in_RDI + 0x170);
              *(undefined8 *)(in_RDI + 0x300) = *(undefined8 *)(in_RDI + 0x178);
              *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(in_RDI + 0x180);
              *(undefined8 *)(in_RDI + 0x310) = *(undefined8 *)(in_RDI + 0x188);
              *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(in_RDI + 400);
              *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)(in_RDI + 0x194);
              *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(in_RDI + 0x198);
              *(undefined4 *)(in_RDI + 0x324) = *(undefined4 *)(in_RDI + 0x19c);
              *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(in_RDI + 0x1a0);
              *(undefined8 *)(in_RDI + 0x330) = *(undefined8 *)(in_RDI + 0x1a8);
            }
          }
          else if (((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
                  ((*(int *)(in_RDI + 0xdc) == 1 &&
                   (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 2)) &&
                    (*(int *)(in_RDI + 0xe8) == 2)))))) {
            puVar6 = (undefined8 *)(in_RDI + 0x2f0);
            if (puVar6 != (undefined8 *)(in_RDI + 0x168)) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                LOCK();
                **(int **)(in_RDI + 0x170) = **(int **)(in_RDI + 0x170) + 1;
                UNLOCK();
              }
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                LOCK();
                iVar8 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (iVar8 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    if ((void *)*puVar6 != (void *)0x0) {
                      free((void *)*puVar6);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar6);
                  }
                }
              }
              *puVar6 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar6 = *(undefined8 *)(in_RDI + 0x168);
              *(undefined8 *)(in_RDI + 0x2f8) = *(undefined8 *)(in_RDI + 0x170);
              *(undefined8 *)(in_RDI + 0x300) = *(undefined8 *)(in_RDI + 0x178);
              *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(in_RDI + 0x180);
              *(undefined8 *)(in_RDI + 0x310) = *(undefined8 *)(in_RDI + 0x188);
              *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(in_RDI + 400);
              *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)(in_RDI + 0x194);
              *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(in_RDI + 0x198);
              *(undefined4 *)(in_RDI + 0x324) = *(undefined4 *)(in_RDI + 0x19c);
              *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(in_RDI + 0x1a0);
              *(undefined8 *)(in_RDI + 0x330) = *(undefined8 *)(in_RDI + 0x1a8);
            }
          }
          else {
            create_group_ops(in_stack_000006a8,in_stack_000006a0);
          }
        }
        if (((ulong)in_RSI->data & 1) != 0) {
          puVar6 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            LOCK();
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (iVar8 == 1) {
              if (*(long *)(in_RDI + 0x188) == 0) {
                if ((void *)*puVar6 != (void *)0x0) {
                  free((void *)*puVar6);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar6);
              }
            }
          }
          *puVar6 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_e4 = 0;
      }
      else {
        create_group_ops(in_stack_000006a8,in_stack_000006a0);
        if (((ulong)in_RSI->data & 1) != 0) {
          puVar6 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            LOCK();
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (iVar8 == 1) {
              if (*(long *)(in_RDI + 0x188) == 0) {
                if ((void *)*puVar6 != (void *)0x0) {
                  free((void *)*puVar6);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar6);
              }
            }
          }
          *puVar6 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_e4 = 0;
      }
    }
    else {
      local_e4 = create_pipeline_int8_x86
                           ((ConvolutionDepthWise_x86 *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffee8);
    }
  }
  else {
    local_e4 = 0;
  }
  return local_e4;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}